

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfusionstyle.cpp
# Opt level: O2

void qt_fusion_draw_mdibutton
               (QPainter *painter,QStyleOptionTitleBar *option,QRect *tmp,bool hover,bool sunken)

{
  QPalette *this;
  undefined8 uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  QBrush *pQVar7;
  QPoint QVar8;
  QPoint QVar9;
  long lVar10;
  undefined8 *puVar11;
  QGradient *pQVar12;
  undefined7 in_register_00000081;
  long in_FS_OFFSET;
  byte bVar13;
  undefined1 auVar14 [16];
  QBrush local_160 [8];
  QPen local_158 [8];
  QLinearGradient gradient;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined4 local_a0;
  undefined4 local_9c;
  undefined8 local_98;
  int local_90;
  int iStack_8c;
  int iStack_88;
  int iStack_84;
  undefined8 local_80;
  int local_78;
  int iStack_74;
  int local_70;
  uint local_6c;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  long local_38;
  
  bVar13 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = option->titleBarState;
  this = &(option->super_QStyleOptionComplex).super_QStyleOption.palette;
  local_9c = 0xaaaaaaaa;
  QPalette::button(this);
  iVar4 = QColor::hue();
  QPalette::button(this);
  iVar5 = QColor::saturation();
  if (0xfe < iVar5) {
    iVar5 = 0xff;
  }
  QPalette::button(this);
  iVar6 = QColor::value();
  iVar3 = (int)((double)iVar6 * 0.7);
  if (0xfe < (int)((double)iVar6 * 0.7)) {
    iVar3 = 0xff;
  }
  auVar14 = QColor::fromHsv(iVar4,iVar5,iVar3,0xff);
  local_a8 = auVar14._0_8_;
  local_a0 = auVar14._8_4_;
  local_9c = CONCAT22(local_9c._2_2_,auVar14._12_2_);
  pQVar7 = QPalette::highlight(this);
  local_b8 = *(undefined8 *)(*(long *)pQVar7 + 8);
  uStack_b0 = *(undefined8 *)(*(long *)pQVar7 + 0x10);
  if ((int)CONCAT71(in_register_00000081,sunken) != 0) {
    QColor::darker((int)&local_b8);
  }
  if ((uVar2 >> 0x10 & 1) == 0) {
    iVar4 = (int)&local_a8;
  }
  else {
    iVar4 = (int)&local_b8;
  }
  QColor::darker(iVar4);
  if (sunken) {
    gradient.super_QGradient._0_16_ = QRect::adjusted(tmp,1,1,-1,-1);
    auVar14 = QColor::darker((int)&local_b8);
    local_78 = auVar14._0_4_;
    iStack_74 = auVar14._4_4_;
    local_70 = auVar14._8_4_;
    local_6c = CONCAT22(local_6c._2_2_,auVar14._12_2_);
  }
  else {
    if (!hover) goto LAB_003975c4;
    gradient.super_QGradient._0_16_ = QRect::adjusted(tmp,1,1,-1,-1);
    local_78 = 1;
    iStack_74 = 0xffff1414;
    local_70 = 0xffffffff;
    local_6c = local_6c & 0xffff0000;
  }
  QPainter::fillRect((QRect *)painter,(QColor *)&gradient);
LAB_003975c4:
  puVar11 = &DAT_00655238;
  pQVar12 = &gradient.super_QGradient;
  for (lVar10 = 0xb; lVar10 != 0; lVar10 = lVar10 + -1) {
    uVar1 = *puVar11;
    pQVar12->m_type = (int)uVar1;
    pQVar12->m_spread = (int)((ulong)uVar1 >> 0x20);
    puVar11 = puVar11 + (ulong)bVar13 * -2 + 1;
    pQVar12 = (QGradient *)((long)pQVar12 + (ulong)bVar13 * -0x10 + 8);
  }
  QVar8 = QRect::center(tmp);
  iVar4 = (tmp->y1).m_i;
  QVar9 = QRect::center(tmp);
  QLinearGradient::QLinearGradient
            ((QLinearGradient *)&gradient.super_QGradient,(double)QVar8.xp.m_i.m_i,(double)iVar4,
             (double)QVar9.xp.m_i.m_i,(double)(tmp->y2).m_i);
  QGradient::setColorAt(0.0,(QColor *)&gradient.super_QGradient);
  QGradient::setColorAt(1.0,(QColor *)&gradient.super_QGradient);
  QPainter::setPen((QColor *)painter);
  local_58 = (tmp->x1).m_i;
  iStack_74 = (tmp->y1).m_i;
  local_78 = local_58 + 2;
  local_48 = (tmp->x2).m_i;
  local_70 = local_48 + -2;
  local_64 = (tmp->y2).m_i;
  local_54 = iStack_74 + 2;
  local_4c = local_64 + -2;
  local_6c = iStack_74;
  local_68 = local_78;
  local_60 = local_70;
  local_5c = local_64;
  local_50 = local_58;
  local_44 = local_54;
  local_40 = local_48;
  local_3c = local_4c;
  QPainter::drawLines((QLine *)painter,(int)&local_78);
  iStack_88 = (tmp->x1).m_i + 1;
  iStack_8c = (tmp->y1).m_i + 1;
  local_98 = CONCAT44(iStack_8c,iStack_88);
  local_90 = (tmp->x2).m_i + -1;
  iStack_84 = (tmp->y2).m_i + -1;
  local_80 = CONCAT44(iStack_84,local_90);
  QPainter::drawPoints((QPoint *)painter,(int)&local_98);
  QPainter::setPen((QColor *)painter);
  iVar4 = (tmp->y1).m_i + 1;
  QPainter::drawLine(painter,(tmp->x1).m_i + 2,iVar4,(tmp->x2).m_i + -2,iVar4);
  iVar4 = (tmp->x1).m_i + 1;
  QPainter::drawLine(painter,iVar4,(tmp->y1).m_i + 2,iVar4,(tmp->y2).m_i + -2);
  QBrush::QBrush(local_160,&gradient.super_QGradient);
  QPen::QPen(local_158,local_160,1.0,SolidLine,SquareCap,BevelJoin);
  QPainter::setPen((QPen *)painter);
  QPen::~QPen(local_158);
  QBrush::~QBrush(local_160);
  iVar4 = (tmp->x2).m_i + 1;
  QPainter::drawLine(painter,iVar4,(tmp->y1).m_i + 2,iVar4,(tmp->y2).m_i + -2);
  QPainter::drawPoint(painter,(tmp->x2).m_i,(tmp->y1).m_i + 1);
  iVar4 = (tmp->y2).m_i + 1;
  QPainter::drawLine(painter,(tmp->x1).m_i + 2,iVar4,(tmp->x2).m_i + -2,iVar4);
  QPainter::drawPoint(painter,(tmp->x1).m_i + 1,(tmp->y2).m_i);
  QPainter::drawPoint(painter,(tmp->x2).m_i + -1,(tmp->y2).m_i);
  QPainter::drawPoint(painter,(tmp->x2).m_i,(tmp->y2).m_i + -1);
  QLinearGradient::~QLinearGradient((QLinearGradient *)&gradient.super_QGradient);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void qt_fusion_draw_mdibutton(QPainter *painter, const QStyleOptionTitleBar *option, const QRect &tmp, bool hover, bool sunken)
{
    bool active = (option->titleBarState & QStyle::State_Active);
    const QColor dark = QColor::fromHsv(option->palette.button().color().hue(),
                                        qMin(255, option->palette.button().color().saturation()),
                                        qMin(255, int(option->palette.button().color().value() * 0.7)));
    const QColor highlight = option->palette.highlight().color();
    const QColor titleBarHighlight(sunken ? highlight.darker(130) : QColor(255, 255, 255, 60));
    const QColor mdiButtonBorderColor(active ? highlight.darker(180): dark.darker(110));

    if (sunken)
        painter->fillRect(tmp.adjusted(1, 1, -1, -1), highlight.darker(120));
    else if (hover)
        painter->fillRect(tmp.adjusted(1, 1, -1, -1), QColor(255, 255, 255, 20));

    const QColor mdiButtonGradientStartColor(0, 0, 0, 40);
    const QColor mdiButtonGradientStopColor(255, 255, 255, 60);

    QLinearGradient gradient(tmp.center().x(), tmp.top(), tmp.center().x(), tmp.bottom());
    gradient.setColorAt(0, mdiButtonGradientStartColor);
    gradient.setColorAt(1, mdiButtonGradientStopColor);

    painter->setPen(mdiButtonBorderColor);
    const QLine lines[4] = {
        QLine(tmp.left() + 2, tmp.top(), tmp.right() - 2, tmp.top()),
        QLine(tmp.left() + 2, tmp.bottom(), tmp.right() - 2, tmp.bottom()),
        QLine(tmp.left(), tmp.top() + 2, tmp.left(), tmp.bottom() - 2),
        QLine(tmp.right(), tmp.top() + 2, tmp.right(), tmp.bottom() - 2)
    };
    painter->drawLines(lines, 4);
    const QPoint points[4] = {
        QPoint(tmp.left() + 1, tmp.top() + 1),
        QPoint(tmp.right() - 1, tmp.top() + 1),
        QPoint(tmp.left() + 1, tmp.bottom() - 1),
        QPoint(tmp.right() - 1, tmp.bottom() - 1)
    };
    painter->drawPoints(points, 4);

    painter->setPen(titleBarHighlight);
    painter->drawLine(tmp.left() + 2, tmp.top() + 1, tmp.right() - 2, tmp.top() + 1);
    painter->drawLine(tmp.left() + 1, tmp.top() + 2, tmp.left() + 1, tmp.bottom() - 2);

    painter->setPen(QPen(gradient, 1));
    painter->drawLine(tmp.right() + 1, tmp.top() + 2, tmp.right() + 1, tmp.bottom() - 2);
    painter->drawPoint(tmp.right() , tmp.top() + 1);

    painter->drawLine(tmp.left() + 2, tmp.bottom() + 1, tmp.right() - 2, tmp.bottom() + 1);
    painter->drawPoint(tmp.left() + 1, tmp.bottom());
    painter->drawPoint(tmp.right() - 1, tmp.bottom());
    painter->drawPoint(tmp.right() , tmp.bottom() - 1);
}